

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void libyuv::ScalePlaneDown4_16
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint16_t *src_ptr,uint16_t *dst_ptr,FilterMode filtering)

{
  int in_ECX;
  undefined4 in_EDX;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  int row_stride;
  _func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_int *ScaleRowDown4;
  int in_stack_00000018;
  int y;
  code *local_38;
  int local_1c;
  int local_14;
  
  if (in_stack_00000018 == 0) {
    local_38 = ScaleRowDown4_16_C;
  }
  else {
    local_38 = ScaleRowDown4Box_16_C;
  }
  local_14 = in_R8D;
  if (in_stack_00000018 == 0) {
    in_stack_00000008 = in_stack_00000008 + (long)(in_R8D << 1) * 2;
    local_14 = 0;
  }
  if (in_stack_00000018 == 1) {
    local_14 = 0;
  }
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    (*local_38)(in_stack_00000008,(long)local_14,ScaleRowDown4,in_EDX);
    in_stack_00000008 = in_stack_00000008 + (long)(in_R8D << 2) * 2;
    ScaleRowDown4 = ScaleRowDown4 + (long)in_R9D * 2;
  }
  return;
}

Assistant:

static void ScalePlaneDown4_16(int src_width,
                               int src_height,
                               int dst_width,
                               int dst_height,
                               int src_stride,
                               int dst_stride,
                               const uint16_t* src_ptr,
                               uint16_t* dst_ptr,
                               enum FilterMode filtering) {
  int y;
  void (*ScaleRowDown4)(const uint16_t* src_ptr, ptrdiff_t src_stride,
                        uint16_t* dst_ptr, int dst_width) =
      filtering ? ScaleRowDown4Box_16_C : ScaleRowDown4_16_C;
  int row_stride = src_stride << 2;
  (void)src_width;
  (void)src_height;
  if (!filtering) {
    src_ptr += src_stride * 2;  // Point to row 2.
    src_stride = 0;
  }
#if defined(HAS_SCALEROWDOWN4_16_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(dst_width, 8)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_16_NEON : ScaleRowDown4_16_NEON;
  }
#endif
#if defined(HAS_SCALEROWDOWN4_16_SSE2)
  if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(dst_width, 8)) {
    ScaleRowDown4 =
        filtering ? ScaleRowDown4Box_16_SSE2 : ScaleRowDown4_16_SSE2;
  }
#endif
#if defined(HAS_SCALEROWDOWN4_16_MMI)
  if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(dst_width, 8)) {
    ScaleRowDown4 = filtering ? ScaleRowDown4Box_16_MMI : ScaleRowDown4_16_MMI;
  }
#endif

  if (filtering == kFilterLinear) {
    src_stride = 0;
  }
  for (y = 0; y < dst_height; ++y) {
    ScaleRowDown4(src_ptr, src_stride, dst_ptr, dst_width);
    src_ptr += row_stride;
    dst_ptr += dst_stride;
  }
}